

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<kj::Directory::Replacer<kj::Directory>_> __thiscall
kj::anon_unknown_8::DiskDirectory::replaceSubdir(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  Directory *pDVar1;
  int osErrorNumber;
  AutoCloseFd AVar2;
  Clock *clock;
  undefined4 in_register_0000000c;
  Replacer<kj::Directory> *extraout_RDX;
  undefined8 __file;
  WriteMode in_R8D;
  size_t *this_00;
  Own<kj::Directory::Replacer<kj::Directory>_> OVar3;
  PathPtr finalName;
  Fault f;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 aStack_c0;
  AutoCloseFd subdirFd;
  Own<const_kj::Directory> local_a0;
  Own<kj::Directory> local_90;
  NullableValue<kj::String> temp;
  AutoCloseFd local_5c;
  mode_t acl;
  Own<kj::Function<int_(kj::StringPtr)>::Iface> local_50;
  PathPtr local_40;
  
  finalName.parts.size_ = CONCAT44(in_register_0000000c,mode);
  finalName.parts.ptr = (String *)path.parts.size_;
  this_00 = &((path.parts.ptr)->content).size_;
  acl = 0x1c0;
  if ((in_R8D & PRIVATE) == 0) {
    acl = 0x1ff;
  }
  local_40.parts.ptr = finalName.parts.ptr;
  local_40.parts.size_ = finalName.parts.size_;
  local_50.ptr = (Iface *)operator_new(0x18);
  (local_50.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002a8880;
  local_50.ptr[1]._vptr_Iface = (_func_int **)this_00;
  local_50.ptr[2]._vptr_Iface = (_func_int **)&acl;
  local_50.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::replaceSubdir(kj::PathPtr,kj::WriteMode)const::{lambda(kj::StringPtr)#1}>>
        ::instance;
  DiskHandle::createNamedTemporary
            ((Maybe<kj::String> *)&f,(DiskHandle *)this_00,finalName,in_R8D,
             (Function<int_(kj::StringPtr)> *)&local_50);
  temp.isSet = (bool)(char)f.exception;
  if ((char)f.exception == '\x01') {
    temp.field_1.value.content.ptr = aStack_c0.value.content.ptr;
    temp.field_1.value.content.size_ = aStack_c0.value.content.size_;
    temp.field_1.value.content.disposer = aStack_c0.value.content.disposer;
    aStack_c0.value.content.ptr = (char *)0x0;
    aStack_c0.value.content.size_ = 0;
  }
  _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&f);
  Own<kj::Function<int_(kj::StringPtr)>::Iface>::dispose(&local_50);
  if (temp.isSet == true) {
    do {
      __file = "";
      if (temp.field_1.value.content.size_ != 0) {
        __file = temp.field_1.value.content.ptr;
      }
      subdirFd.fd = openat((int)*this_00,(char *)__file,0x90000);
      if (-1 < subdirFd.fd) goto LAB_0023a01d;
      osErrorNumber = _::Debug::getOsErrorNumber(false);
    } while (osErrorNumber == -1);
    if (osErrorNumber != 0) {
      _::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x56d,osErrorNumber,"open(just-created-temporary)","");
      _::Debug::Fault::fatal(&f);
    }
LAB_0023a01d:
    UnwindDetector::UnwindDetector(&subdirFd.unwindDetector);
    AutoCloseFd::AutoCloseFd(&local_5c,&subdirFd);
    newDiskDirectory((kj *)&local_90,&local_5c);
    PathPtr::toString((String *)&f,&local_40,false);
    AVar2 = (AutoCloseFd)operator_new(0x60);
    pDVar1 = local_90.ptr;
    local_a0.disposer = local_90.disposer;
    local_90.ptr = (Directory *)0x0;
    *(WriteMode *)((long)AVar2 + 8) = in_R8D;
    *(undefined ***)AVar2 = &PTR_get_002a88e8;
    *(Disposer **)((long)AVar2 + 0x10) = local_90.disposer;
    *(Directory **)((long)AVar2 + 0x18) = pDVar1;
    local_a0.ptr = (Directory *)0x0;
    *(size_t **)((long)AVar2 + 0x20) = this_00;
    *(char **)((long)AVar2 + 0x28) = temp.field_1.value.content.ptr;
    *(size_t *)((long)AVar2 + 0x30) = temp.field_1.value.content.size_;
    *(ArrayDisposer **)((long)AVar2 + 0x38) = temp.field_1.value.content.disposer;
    temp.field_1.value.content.ptr = (char *)0x0;
    temp.field_1.value.content.size_ = 0;
    *(Exception **)((long)AVar2 + 0x40) = f.exception;
    *(char **)((long)AVar2 + 0x48) = aStack_c0.value.content.ptr;
    *(size_t *)((long)AVar2 + 0x50) = aStack_c0.value.content.size_;
    f.exception = (Exception *)0x0;
    *(undefined1 *)((long)AVar2 + 0x58) = 0;
    Own<const_kj::Directory>::dispose(&local_a0);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::Directory>>::
          instance;
    (this->super_DiskHandle).fd = AVar2;
    Array<char>::~Array((Array<char> *)&f);
    Own<kj::Directory>::dispose(&local_90);
    AutoCloseFd::~AutoCloseFd(&local_5c);
    AutoCloseFd::~AutoCloseFd(&subdirFd);
  }
  else {
    clock = nullClock();
    newInMemoryDirectory((kj *)&local_a0,clock);
    AVar2 = (AutoCloseFd)operator_new(0x20);
    pDVar1 = local_a0.ptr;
    f.exception = (Exception *)local_a0.disposer;
    local_a0.ptr = (Directory *)0x0;
    *(undefined4 *)((long)AVar2 + 8) = 3;
    *(undefined ***)AVar2 = &PTR_get_002a8958;
    *(Disposer **)((long)AVar2 + 0x10) = local_a0.disposer;
    *(Directory **)((long)AVar2 + 0x18) = pDVar1;
    Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)&f);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::BrokenReplacer<kj::Directory>>::
          instance;
    (this->super_DiskHandle).fd = AVar2;
    Own<kj::Directory>::dispose((Own<kj::Directory> *)&local_a0);
  }
  _::NullableValue<kj::String>::~NullableValue(&temp);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<Replacer<Directory>> replaceSubdir(PathPtr path, WriteMode mode) const override {
    return DiskHandle::replaceSubdir(path, mode);
  }